

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_heresiarch.cpp
# Opt level: O1

int AF_A_SorcSpinBalls(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  AActor *pAVar2;
  undefined8 *puVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined8 uVar6;
  PClass *pPVar7;
  PClassActor *pPVar8;
  AActor *pAVar9;
  char *__assertion;
  bool bVar10;
  DVector3 pos;
  FName local_44;
  DVector3 local_40;
  
  pPVar4 = AHeresiarch::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005b766b;
  }
  if (((param->field_0).field_3.Type == '\x03') &&
     (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
    pAVar2 = (AActor *)(param->field_0).field_1.a;
    if (pAVar2 != (AActor *)0x0) {
      if ((pAVar2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(pAVar2->super_DThinker).super_DObject._vptr_DObject)(pAVar2);
        (pAVar2->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar7 = (pAVar2->super_DThinker).super_DObject.Class;
      bVar10 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar10) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar10 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (!bVar10) {
        __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AHeresiarch))";
        goto LAB_005b766b;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if ((numparam != 1) && (VVar1 = param[1].field_0.field_3.Type, VVar1 != 0xff)) {
      if ((VVar1 != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_005b7640;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar6 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar6;
        }
        pPVar7 = (PClass *)puVar3[1];
        bVar10 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar4 && bVar10) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar10 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar4) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar10) {
          __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005b766b;
        }
      }
    }
    if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
       ((VVar1 == '\x03' &&
        ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
      pAVar2->SpawnState = pAVar2->SpawnState + 2;
      pAVar2->args[2] = 7;
      pAVar2->args[3] = 5;
      pAVar2->args[0] = 0;
      pAVar2->args[4] = 7;
      pAVar2[1].super_DThinker.super_DObject.Class = (PClass *)0x3ff0000000000000;
      local_40.Z = (pAVar2->Height - pAVar2->Floorclip) + (pAVar2->__Pos).Z;
      local_40.X = (pAVar2->__Pos).X;
      local_40.Y = (pAVar2->__Pos).Y;
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall1",false);
      pPVar8 = ClassForSpawn(&local_44);
      pAVar9 = AActor::StaticSpawn(pPVar8,&local_40,NO_REPLACE,false);
      if (pAVar9 != (AActor *)0x0) {
        (pAVar9->target).field_0.p = pAVar2;
        pAVar9->special2 = 0x12;
      }
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall2",false);
      pPVar8 = ClassForSpawn(&local_44);
      pAVar9 = AActor::StaticSpawn(pPVar8,&local_40,NO_REPLACE,false);
      if (pAVar9 != (AActor *)0x0) {
        (pAVar9->target).field_0.p = pAVar2;
      }
      local_44.Index = FName::NameManager::FindName(&FName::NameData,"SorcBall3",false);
      pPVar8 = ClassForSpawn(&local_44);
      pAVar9 = AActor::StaticSpawn(pPVar8,&local_40,NO_REPLACE,false);
      if (pAVar9 != (AActor *)0x0) {
        (pAVar9->target).field_0.p = pAVar2;
      }
      return 0;
    }
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
    ;
  }
  else {
LAB_005b7640:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_005b766b:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_heresiarch.cpp"
                ,0xd8,"int AF_A_SorcSpinBalls(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SorcSpinBalls)
{
	PARAM_ACTION_PROLOGUE_TYPE(AHeresiarch);

	AActor *mo;

	self->SpawnState += 2;		// [RH] Don't spawn balls again
	A_SlowBalls(self);
	self->args[0] = 0;								// Currently no defense
	self->args[3] = SORC_NORMAL;
	self->args[4] = SORCBALL_INITIAL_SPEED;		// Initial orbit speed
	self->BallAngle = 1.;

	DVector3 pos = self->PosPlusZ(-self->Floorclip + self->Height);
	
	mo = Spawn("SorcBall1", pos, NO_REPLACE);
	if (mo)
	{
		mo->target = self;
		mo->special2 = SORCFX4_RAPIDFIRE_TIME;
	}
	mo = Spawn("SorcBall2", pos, NO_REPLACE);
	if (mo) mo->target = self;
	mo = Spawn("SorcBall3", pos, NO_REPLACE);
	if (mo) mo->target = self;
	return 0;
}